

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElementAnimation.cpp
# Opt level: O0

bool __thiscall
Rml::ElementAnimation::InternalAddKey
          (ElementAnimation *this,float time,Property *in_property,Element *element,Tween tween)

{
  Element *element_00;
  bool bVar1;
  Units UVar2;
  char *pcVar3;
  undefined8 uVar4;
  reference pvVar5;
  size_type sVar6;
  String local_b0;
  byte local_89;
  Property *pPStack_88;
  bool result;
  Property *property;
  String local_70;
  char *local_50;
  char *property_type;
  Element *pEStack_40;
  Units valid_units;
  Element *element_local;
  Property *in_property_local;
  ElementAnimation *pEStack_28;
  float time_local;
  ElementAnimation *this_local;
  Tween tween_local;
  
  tween_local._0_8_ = tween.callback;
  this_local = tween._0_8_;
  pEStack_40 = element;
  element_local = (Element *)in_property;
  in_property_local._4_4_ = time;
  pEStack_28 = this;
  UVar2 = operator|(NUMBER_LENGTH_PERCENT,ANGLE);
  UVar2 = operator|(UVar2,COLOUR);
  UVar2 = operator|(UVar2,TRANSFORM);
  UVar2 = operator|(UVar2,KEYWORD);
  UVar2 = operator|(UVar2,DECORATOR);
  property_type._4_4_ = operator|(UVar2,FILTER);
  UVar2 = operator&(*(Units *)&(element_local->children).
                               super__Vector_base<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                    property_type._4_4_);
  bVar1 = Any(UVar2);
  if (bVar1) {
    ::std::vector<Rml::AnimationKey,std::allocator<Rml::AnimationKey>>::
    emplace_back<float&,Rml::Property_const&,Rml::Tween&>
              ((vector<Rml::AnimationKey,std::allocator<Rml::AnimationKey>> *)&this->keys,
               (float *)((long)&in_property_local + 4),(Property *)element_local,
               (Tween *)&this_local);
    pvVar5 = ::std::vector<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>::back(&this->keys)
    ;
    element_00 = pEStack_40;
    pPStack_88 = &pvVar5->property;
    local_89 = 1;
    if ((pvVar5->property).unit == TRANSFORM) {
      sVar6 = ::std::vector<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>::size
                        (&this->keys);
      local_89 = PrepareTransforms(&this->keys,element_00,(int)sVar6 + -1);
    }
    else if ((pvVar5->property).unit == DECORATOR) {
      pvVar5 = ::std::vector<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>::back
                         (&this->keys);
      PrepareDecorator(pvVar5);
    }
    else if ((pvVar5->property).unit == FILTER) {
      pvVar5 = ::std::vector<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>::back
                         (&this->keys);
      PrepareFilter(pvVar5);
    }
    if ((local_89 & 1) == 0) {
      Property::ToString_abi_cxx11_(&local_b0,(Property *)element_local);
      uVar4 = ::std::__cxx11::string::c_str();
      Log::Message(LT_WARNING,"Could not add animation key with property \'%s\'.",uVar4);
      ::std::__cxx11::string::~string((string *)&local_b0);
      ::std::vector<Rml::AnimationKey,_std::allocator<Rml::AnimationKey>_>::pop_back(&this->keys);
    }
    tween_local.callback._7_1_ = (bool)(local_89 & 1);
  }
  else {
    pcVar3 = "Property value does not";
    if (*(int *)&(element_local->children).
                 super__Vector_base<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>,_std::allocator<std::unique_ptr<Rml::Element,_Rml::Releaser<Rml::Element>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage == 0x8000000) {
      pcVar3 = "Box shadows do not";
    }
    local_50 = pcVar3;
    Property::ToString_abi_cxx11_(&local_70,(Property *)element_local);
    uVar4 = ::std::__cxx11::string::c_str();
    Log::Message(LT_WARNING,"%s support animations or transitions. Value: %s",pcVar3,uVar4);
    ::std::__cxx11::string::~string((string *)&local_70);
    tween_local.callback._7_1_ = false;
  }
  return tween_local.callback._7_1_;
}

Assistant:

bool ElementAnimation::InternalAddKey(float time, const Property& in_property, Element& element, Tween tween)
{
	const Units valid_units =
		(Unit::NUMBER_LENGTH_PERCENT | Unit::ANGLE | Unit::COLOUR | Unit::TRANSFORM | Unit::KEYWORD | Unit::DECORATOR | Unit::FILTER);

	if (!Any(in_property.unit & valid_units))
	{
		const char* property_type = (in_property.unit == Unit::BOXSHADOWLIST ? "Box shadows do not" : "Property value does not");
		Log::Message(Log::LT_WARNING, "%s support animations or transitions. Value: %s", property_type, in_property.ToString().c_str());
		return false;
	}

	keys.emplace_back(time, in_property, tween);
	Property& property = keys.back().property;
	bool result = true;

	if (property.unit == Unit::TRANSFORM)
	{
		result = PrepareTransforms(keys, element, (int)keys.size() - 1);
	}
	else if (property.unit == Unit::DECORATOR)
	{
		PrepareDecorator(keys.back());
	}
	else if (property.unit == Unit::FILTER)
	{
		PrepareFilter(keys.back());
	}

	if (!result)
	{
		Log::Message(Log::LT_WARNING, "Could not add animation key with property '%s'.", in_property.ToString().c_str());
		keys.pop_back();
	}

	return result;
}